

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O2

void __thiscall CVmHashEntryDict::~CVmHashEntryDict(CVmHashEntryDict *this)

{
  vm_dict_entry *pvVar1;
  vm_dict_entry *pvVar2;
  
  (this->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CVmHashEntryDict_0035bc38;
  pvVar2 = this->list_;
  while (pvVar2 != (vm_dict_entry *)0x0) {
    pvVar1 = pvVar2->nxt_;
    operator_delete(pvVar2,0x18);
    this->list_ = pvVar1;
    pvVar2 = pvVar1;
  }
  CVmHashEntry::~CVmHashEntry((CVmHashEntry *)this);
  return;
}

Assistant:

~CVmHashEntryDict()
    {
        /* delete all of our entries */
        while (list_ != 0)
        {
            vm_dict_entry *nxt;

            /* note the next entry */
            nxt = list_->nxt_;

            /* delete the current entry */
            delete list_;

            /* move on to the next entry */
            list_ = nxt;
        }
    }